

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this,csubstr s,bool was_quoted)

{
  size_t *psVar1;
  code *pcVar2;
  char cVar3;
  Location loc;
  csubstr s_00;
  ulong uVar4;
  bool bVar5;
  error_flags eVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ro_substr chars;
  basic_substring<const_char> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  local_58.len = s.len;
  local_58.str = s.str;
  if (local_58.len == 0) {
    if (!was_quoted && local_58.str == (char *)0x0) {
      return;
    }
    std::ostream::write((char *)((this->
                                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ).m_stream + 0x10),0x214626);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 2;
    return;
  }
  if (was_quoted) goto LAB_001b77da;
  bVar5 = basic_substring<const_char>::is_number(&local_58);
  if (bVar5) {
LAB_001b78ac:
    sVar7 = local_58.len;
    if (local_58.str != (char *)0x0 && local_58.len != 0) {
      std::ostream::write((char *)((this->
                                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).m_stream + 0x10),(long)local_58.str);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + sVar7;
    }
  }
  else {
    if (local_58.len == 0) {
LAB_001b7951:
      if ((1 < local_58.len) && (*local_58.str == '<')) {
        lVar11 = 0;
        do {
          lVar10 = lVar11;
          if (lVar10 == 1) break;
          lVar11 = lVar10 + 1;
        } while (local_58.str[lVar10 + 1] == "<<"[lVar10 + 1]);
        if (lVar10 != 0) goto LAB_001b77da;
      }
      if (local_58.len == 0) {
LAB_001b79c8:
        chars.len = 0xc;
        chars.str = "#:-?,\n{}[]\'\"";
        sVar7 = basic_substring<const_char>::first_of(&local_58,chars,0);
        if (sVar7 == 0xffffffffffffffff) goto LAB_001b78ac;
      }
      else if (local_58.str[local_58.len - 1] != ' ') {
        uVar4 = 0;
        do {
          uVar9 = uVar4;
          if (uVar9 == 3) break;
          uVar4 = uVar9 + 1;
        } while (local_58.str[local_58.len - 1] != " \n\t\r"[uVar9 + 1]);
        if (2 < uVar9) goto LAB_001b79c8;
      }
    }
    else if (*local_58.str != ' ') {
      uVar4 = 0;
      do {
        uVar9 = uVar4;
        if (uVar9 == 8) break;
        uVar4 = uVar9 + 1;
      } while (*local_58.str != " \n\t\r*&%@`"[uVar9 + 1]);
      if (7 < uVar9) goto LAB_001b7951;
    }
LAB_001b77da:
    sVar7 = basic_substring<const_char>::first_of(&local_58,'\"',0);
    sVar8 = basic_substring<const_char>::first_of(&local_58,'\'',0);
    if (sVar8 == 0xffffffffffffffff && sVar7 != 0xffffffffffffffff) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      sVar7 = local_58.len;
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
      if (local_58.str != (char *)0x0 && local_58.len != 0) {
        std::ostream::write((char *)((this->
                                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).m_stream + 0x10),(long)local_58.str);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + sVar7;
      }
      cVar3 = (char)(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_stream;
    }
    else {
      if (sVar7 != 0xffffffffffffffff || sVar8 == 0xffffffffffffffff) {
        s_00.len = local_58.len;
        s_00.str = local_58.str;
        _write_scalar_squo(this,s_00,0);
        return;
      }
      sVar7 = basic_substring<const_char>::first_of(&local_58,'\n',0);
      if (sVar7 != 0xffffffffffffffff) {
        lVar11 = 0;
        do {
          sVar7 = basic_substring<const_char>::first_of(&local_58,'\n',sVar7 + 1);
          lVar11 = lVar11 + -1;
        } while (sVar7 != 0xffffffffffffffff);
        if (lVar11 != 0) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_48 = 0;
          uStack_40 = 0x5b6f;
          local_38 = 0;
          pcStack_30 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_28 = 0x65;
          loc.super_LineCol.col = 0;
          loc.super_LineCol.offset = SUB168(ZEXT816(0x5b6f) << 0x40,0);
          loc.super_LineCol.line = SUB168(ZEXT816(0x5b6f) << 0x40,8);
          loc.name.str = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          loc.name.len = 0x65;
          error("check failed: s.count(\'\\n\') == 0",0x20,loc);
        }
      }
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      sVar7 = local_58.len;
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
      if (local_58.str != (char *)0x0 && local_58.len != 0) {
        std::ostream::write((char *)((this->
                                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).m_stream + 0x10),(long)local_58.str);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + sVar7;
      }
      cVar3 = (char)(this->
                    super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_stream;
    }
    std::ostream::put(cVar3 + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar(csubstr s, bool was_quoted)
{
    // this block of code needed to be moved to before the needs_quotes
    // assignment to work around a g++ optimizer bug where (s.str != nullptr)
    // was evaluated as true even if s.str was actually a nullptr (!!!)
    if(s.len == size_t(0))
    {
        if(was_quoted || s.str != nullptr)
            this->Writer::_do_write("''");
        return;
    }

    const bool needs_quotes = (
        was_quoted
        ||
        (
            ( ! s.is_number())
            &&
            (
                // has leading whitespace
                // looks like reference or anchor
                // would be treated as a directive
                // see https://www.yaml.info/learn/quote.html#noplain
                s.begins_with_any(" \n\t\r*&%@`")
                ||
                s.begins_with("<<")
                ||
                // has trailing whitespace
                s.ends_with_any(" \n\t\r")
                ||
                // has special chars
                (s.first_of("#:-?,\n{}[]'\"") != npos)
            )
        )
    );

    if( ! needs_quotes)
    {
        this->Writer::_do_write(s);
    }
    else
    {
        const bool has_dquotes = s.first_of( '"') != npos;
        const bool has_squotes = s.first_of('\'') != npos;
        if(!has_squotes && has_dquotes)
        {
            this->Writer::_do_write('\'');
            this->Writer::_do_write(s);
            this->Writer::_do_write('\'');
        }
        else if(has_squotes && !has_dquotes)
        {
            RYML_ASSERT(s.count('\n') == 0);
            this->Writer::_do_write('"');
            this->Writer::_do_write(s);
            this->Writer::_do_write('"');
        }
        else
        {
            _write_scalar_squo(s, /*FIXME FIXME FIXME*/0);
        }
    }
}